

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash.c
# Opt level: O1

pchar * p_crypto_hash_get_string(PCryptoHash *hash)

{
  uint uVar1;
  byte *pbVar2;
  pchar *ppVar3;
  ulong uVar4;
  
  if (hash == (PCryptoHash *)0x0) {
    return (pchar *)0x0;
  }
  if (hash->closed == 0) {
    (*hash->finish)(hash->context);
    hash->closed = 1;
  }
  pbVar2 = (*hash->digest)(hash->context);
  if ((pbVar2 != (byte *)0x0) &&
     (ppVar3 = (pchar *)p_malloc0((ulong)(hash->hash_len * 2 + 1)), ppVar3 != (pchar *)0x0)) {
    uVar1 = hash->hash_len;
    if ((ulong)uVar1 == 0) {
      return ppVar3;
    }
    uVar4 = 0;
    do {
      ppVar3[uVar4 & 0xffffffff] = "0123456789abcdef"[*pbVar2 >> 4];
      ppVar3[(uVar4 & 0xffffffff) + 1] = "0123456789abcdef"[*pbVar2 & 0xf];
      uVar4 = uVar4 + 2;
      pbVar2 = pbVar2 + 1;
    } while ((ulong)uVar1 * 2 != uVar4);
    return ppVar3;
  }
  return (pchar *)0x0;
}

Assistant:

P_LIB_API pchar *
p_crypto_hash_get_string (PCryptoHash *hash)
{
	pchar		*ret;
	const puchar	*digest;

	if (P_UNLIKELY (hash == NULL))
		return NULL;

	if (!hash->closed) {
		hash->finish (hash->context);
		hash->closed = TRUE;
	}

	if (P_UNLIKELY ((digest = hash->digest (hash->context)) == NULL))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (hash->hash_len * 2 + 1)) == NULL))
		return NULL;

	pp_crypto_hash_digest_to_hex (digest, hash->hash_len, ret);

	return ret;
}